

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void __thiscall gnilk::LogManager::Close(LogManager *this)

{
  element_type *peVar1;
  element_type *this_00;
  shared_ptr<gnilk::LogIPCBase> local_38 [2];
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  LogManager *this_local;
  
  if ((this->isInitialized & 1U) != 0) {
    lock._M_device = (mutex_type *)this;
    std::lock_guard<std::mutex>::lock_guard(&local_18,&this->instLock);
    this->bQuitSinkThread = true;
    std::thread::join();
    SendToSinks(this);
    peVar1 = std::__shared_ptr_access<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ipcHandler);
    (*peVar1->_vptr_LogIPCBase[3])();
    std::shared_ptr<gnilk::LogIPCBase>::shared_ptr(local_38,(nullptr_t)0x0);
    std::shared_ptr<gnilk::LogIPCBase>::operator=(&this->ipcHandler,local_38);
    std::shared_ptr<gnilk::LogIPCBase>::~shared_ptr(local_38);
    this_00 = std::__shared_ptr_access<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->cache);
    LogCache::Clear(this_00);
    std::
    vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
    ::clear(&this->sinks);
    this->isInitialized = false;
    std::lock_guard<std::mutex>::~lock_guard(&local_18);
  }
  return;
}

Assistant:

void LogManager::Close() {
    // This can happen if someone calls close explicitly
    if (!isInitialized) {
        return;
    }
    // event pipe will close through DTOR
    std::lock_guard<std::mutex> lock(instLock);
    // Quit the sink-thread
    bQuitSinkThread = true;
    sinkThread.join();

    // Send any left-overs from the queue
    SendToSinks();

    // Close and clear internal stuff
    ipcHandler->Close();
    ipcHandler = nullptr;   // Must set this reference to null

    cache->Clear();
    sinks.clear();
    // logInstances.clear();    - DO NOT CLEAR THIS!!!!
    isInitialized = false;
}